

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transforms.c
# Opt level: O0

mat4_t * mat4_ortho(mat4_t *__return_storage_ptr__,float left,float right,float bottom,float top)

{
  float top_local;
  float bottom_local;
  float right_local;
  float left_local;
  
  mat4_ortho4(__return_storage_ptr__,left,right,bottom,top,-1.0,1.0);
  return __return_storage_ptr__;
}

Assistant:

mat4_t
mat4_ortho(float left, float right, float bottom, float top) {
    return mat4_ortho4(left, right, bottom, top, -1.0f, 1.0f);
}